

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

Iterator * __thiscall
ctemplate::TemplateDictionary::CreateSectionIterator
          (TemplateDictionary *this,TemplateString *section_name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  TemplateId TVar4;
  second_type pvVar5;
  Iterator *pIVar6;
  Iterator *unaff_RBX;
  TemplateDictionary *d;
  TemplateDictionary *pTVar7;
  bool bVar8;
  
  bVar8 = false;
  pTVar7 = this;
  do {
    psVar1 = pTVar7->section_dict_;
    if (psVar1 != (small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                   *)0x0) {
      TVar4 = TemplateString::GetGlobalId(section_name);
      pvVar5 = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (psVar1,TVar4);
      if (pvVar5 != (second_type)0x0) {
        unaff_RBX = (Iterator *)operator_new(0x18);
        ppTVar2 = (pvVar5->
                  super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppTVar3 = (pvVar5->
                  super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        unaff_RBX->_vptr_Iterator = (_func_int **)&PTR__Iterator_0014e5b8;
        unaff_RBX[1]._vptr_Iterator = (_func_int **)ppTVar2;
        unaff_RBX[2]._vptr_Iterator = (_func_int **)ppTVar3;
        break;
      }
    }
    pTVar7 = pTVar7->parent_dict_;
    bVar8 = pTVar7 == (TemplateDictionary *)0x0;
  } while (!bVar8);
  if (!bVar8) {
    return unaff_RBX;
  }
  if (this->template_global_dict_owner_ != (TemplateDictionary *)0x0) {
    pTVar7 = this->template_global_dict_owner_->template_global_dict_;
    if ((pTVar7 != (TemplateDictionary *)0x0) &&
       (psVar1 = pTVar7->section_dict_,
       psVar1 != (small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                  *)0x0)) {
      TVar4 = TemplateString::GetGlobalId(section_name);
      pvVar5 = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (psVar1,TVar4);
      if (pvVar5 != (second_type)0x0) {
        pIVar6 = (Iterator *)operator_new(0x18);
        ppTVar2 = (pvVar5->
                  super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppTVar3 = (pvVar5->
                  super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pIVar6->_vptr_Iterator = (_func_int **)&PTR__Iterator_0014e5b8;
        pIVar6[1]._vptr_Iterator = (_func_int **)ppTVar2;
        pIVar6[2]._vptr_Iterator = (_func_int **)ppTVar3;
        return pIVar6;
      }
    }
    __assert_fail("\"Call IsHiddenSection before GetDictionaries\" && 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                  ,0x404,
                  "virtual TemplateDictionaryInterface::Iterator *ctemplate::TemplateDictionary::CreateSectionIterator(const TemplateString &) const"
                 );
  }
  __assert_fail("template_global_dict_owner_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x3fc,
                "virtual TemplateDictionaryInterface::Iterator *ctemplate::TemplateDictionary::CreateSectionIterator(const TemplateString &) const"
               );
}

Assistant:

TemplateDictionaryInterface::Iterator*
TemplateDictionary::CreateSectionIterator(
    const TemplateString& section_name) const {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->section_dict_) {
      if (const DictVector* it = find_ptr2(*d->section_dict_, section_name.GetGlobalId())) {
        // Found it!  Return it as an Iterator
        return MakeIterator(*it);
      }
    }
  }
  // Check the template global dictionary.
  assert(template_global_dict_owner_);
  const TemplateDictionary* template_global_dict =
      template_global_dict_owner_->template_global_dict_;
  if (template_global_dict && template_global_dict->section_dict_) {
    if (const DictVector* it = find_ptr2(*template_global_dict->section_dict_, section_name.GetGlobalId())) {
      return MakeIterator(*it);
    }
  }
  assert("Call IsHiddenSection before GetDictionaries" && 0);
  abort();
}